

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeLast(BtCursor *pCur,int *pRes)

{
  undefined4 *in_RSI;
  BtCursor *in_RDI;
  int rc;
  int local_14;
  
  local_14 = moveToRoot(in_RDI);
  if (local_14 == 0) {
    *in_RSI = 0;
    local_14 = moveToRightmost(in_RDI);
    if (local_14 == 0) {
      in_RDI->curFlags = in_RDI->curFlags | 8;
    }
    else {
      in_RDI->curFlags = in_RDI->curFlags & 0xf7;
    }
  }
  else if (local_14 == 0x10) {
    *in_RSI = 1;
    local_14 = 0;
  }
  return local_14;
}

Assistant:

static SQLITE_NOINLINE int btreeLast(BtCursor *pCur, int *pRes){
  int rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->eState==CURSOR_VALID );
    *pRes = 0;
    rc = moveToRightmost(pCur);
    if( rc==SQLITE_OK ){
      pCur->curFlags |= BTCF_AtLast;
    }else{
      pCur->curFlags &= ~BTCF_AtLast;
    }
  }else if( rc==SQLITE_EMPTY ){
    assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
    *pRes = 1;
    rc = SQLITE_OK;
  }
  return rc;
}